

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testInvalidRandomUniformDistributionWrongMinMax(void)

{
  ulong uVar1;
  bool bVar2;
  ModelDescription *pMVar3;
  FeatureDescription *pFVar4;
  FeatureType *pFVar5;
  ArrayFeatureType *pAVar6;
  NeuralNetwork *pNVar7;
  NeuralNetworkLayer *this;
  RandomUniformLikeLayerParams *pRVar8;
  ostream *poVar9;
  string *psVar10;
  long lVar11;
  RandomUniformStaticLayerParams *this_00;
  RandomUniformDynamicLayerParams *pRVar12;
  undefined8 *puVar13;
  int iVar14;
  char *pcVar15;
  Model m;
  Result res3;
  Result res2;
  Result res1;
  
  CoreML::Specification::Model::Model(&m);
  pMVar3 = CoreML::Specification::Model::_internal_mutable_description(&m);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->input_);
  uVar1 = (pFVar4->super_MessageLite)._internal_metadata_.ptr_;
  puVar13 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar13 = (undefined8 *)*puVar13;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar4->name_,"input",puVar13);
  pFVar5 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar4);
  pAVar6 = CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,3);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,5);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,2);
  pMVar3 = CoreML::Specification::Model::_internal_mutable_description(&m);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->output_);
  uVar1 = (pFVar4->super_MessageLite)._internal_metadata_.ptr_;
  puVar13 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar13 = (undefined8 *)*puVar13;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar4->name_,"output",puVar13);
  pFVar5 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar4);
  pAVar6 = CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,3);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,5);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,2);
  pNVar7 = CoreML::Specification::Model::_internal_mutable_neuralnetwork(&m);
  pNVar7->arrayinputshapemapping_ = 1;
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (&pNVar7->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(this,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this,"output");
  pRVar8 = CoreML::Specification::NeuralNetworkLayer::_internal_mutable_randomuniformlike(this);
  pRVar8->minval_ = 1.2;
  pRVar8->maxval_ = 0.4;
  CoreML::validate<(MLModelType)500>(&res1,&m);
  bVar2 = CoreML::Result::good(&res1);
  if (bVar2) {
    poVar9 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,0x162b);
    poVar9 = std::operator<<(poVar9,": error: ");
    pcVar15 = "!((res1).good())";
  }
  else {
    psVar10 = CoreML::Result::message_abi_cxx11_(&res1);
    lVar11 = std::__cxx11::string::find((char *)psVar10,0x2e308c);
    if (lVar11 != -1) {
      this_00 = CoreML::Specification::NeuralNetworkLayer::_internal_mutable_randomuniformstatic
                          (this);
      CoreML::Specification::RandomUniformStaticLayerParams::_internal_add_outputshape(this_00,3);
      this_00->minval_ = 1.2;
      this_00->maxval_ = 0.4;
      CoreML::validate<(MLModelType)500>(&res2,&m);
      bVar2 = CoreML::Result::good(&res2);
      if (bVar2) {
        poVar9 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                );
        poVar9 = std::operator<<(poVar9,":");
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,0x1634);
        poVar9 = std::operator<<(poVar9,": error: ");
        pcVar15 = "!((res2).good())";
LAB_0015b86f:
        poVar9 = std::operator<<(poVar9,pcVar15);
        poVar9 = std::operator<<(poVar9," was false, expected true.");
        std::endl<char,std::char_traits<char>>(poVar9);
        iVar14 = 1;
      }
      else {
        psVar10 = CoreML::Result::message_abi_cxx11_(&res2);
        lVar11 = std::__cxx11::string::find((char *)psVar10,0x2e308c);
        if (lVar11 == -1) {
          poVar9 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                  );
          poVar9 = std::operator<<(poVar9,":");
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,0x1635);
          poVar9 = std::operator<<(poVar9,": error: ");
          pcVar15 = "res2.message().find(\"smaller\") != std::string::npos";
          goto LAB_0015b86f;
        }
        pRVar12 = CoreML::Specification::NeuralNetworkLayer::_internal_mutable_randomuniformdynamic
                            (this);
        pRVar12->minval_ = 1.2;
        pRVar12->maxval_ = 0.4;
        CoreML::validate<(MLModelType)500>(&res3,&m);
        bVar2 = CoreML::Result::good(&res3);
        if (bVar2) {
          poVar9 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                  );
          poVar9 = std::operator<<(poVar9,":");
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,0x163c);
          poVar9 = std::operator<<(poVar9,": error: ");
          pcVar15 = "!((res3).good())";
LAB_0015b8fe:
          poVar9 = std::operator<<(poVar9,pcVar15);
          poVar9 = std::operator<<(poVar9," was false, expected true.");
          std::endl<char,std::char_traits<char>>(poVar9);
          iVar14 = 1;
        }
        else {
          psVar10 = CoreML::Result::message_abi_cxx11_(&res3);
          iVar14 = 0;
          lVar11 = std::__cxx11::string::find((char *)psVar10,0x2e308c);
          if (lVar11 == -1) {
            poVar9 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                    );
            poVar9 = std::operator<<(poVar9,":");
            poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,0x163d);
            poVar9 = std::operator<<(poVar9,": error: ");
            pcVar15 = "res3.message().find(\"smaller\") != std::string::npos";
            goto LAB_0015b8fe;
          }
        }
        std::__cxx11::string::~string((string *)&res3.m_message);
      }
      std::__cxx11::string::~string((string *)&res2.m_message);
      goto LAB_0015b934;
    }
    poVar9 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,0x162c);
    poVar9 = std::operator<<(poVar9,": error: ");
    pcVar15 = "res1.message().find(\"smaller\") != std::string::npos";
  }
  poVar9 = std::operator<<(poVar9,pcVar15);
  poVar9 = std::operator<<(poVar9," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar9);
  iVar14 = 1;
LAB_0015b934:
  std::__cxx11::string::~string((string *)&res1.m_message);
  CoreML::Specification::Model::~Model(&m);
  return iVar14;
}

Assistant:

int testInvalidRandomUniformDistributionWrongMinMax() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output");

    // value of minval should be smaller than value of maxval

    auto* params1 = layers->mutable_randomuniformlike();
    params1->set_minval(1.2f);
    params1->set_maxval(0.4f);

    Result res1 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res1);
    ML_ASSERT(res1.message().find("smaller") != std::string::npos);

    auto* params2 = layers->mutable_randomuniformstatic();
    params2->add_outputshape(3);
    params2->set_minval(1.2f);
    params2->set_maxval(0.4f);

    Result res2 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res2);
    ML_ASSERT(res2.message().find("smaller") != std::string::npos);

    auto* params3 = layers->mutable_randomuniformdynamic();
    params3->set_minval(1.2f);
    params3->set_maxval(0.4f);

    Result res3 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res3);
    ML_ASSERT(res3.message().find("smaller") != std::string::npos);

    return 0;
}